

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Error epilogProcessor(XML_Parser parser,char *s,char *end,char **nextPtr)

{
  bool bVar1;
  int iVar2;
  char *in_RAX;
  XML_Error unaff_EBP;
  char *next;
  char *local_38;
  
  *(code **)((long)parser + 0x208) = epilogProcessor;
  *(char **)((long)parser + 0x218) = s;
  local_38 = in_RAX;
  do {
    iVar2 = (*(code *)**(undefined8 **)((long)parser + 0x118))
                      (*(undefined8 **)((long)parser + 0x118),s,end,&local_38);
    *(char **)((long)parser + 0x220) = local_38;
    bVar1 = false;
    if (iVar2 < 0xb) {
      switch(iVar2) {
      case 0:
        *(char **)((long)parser + 0x218) = local_38;
        unaff_EBP = XML_ERROR_INVALID_TOKEN;
        break;
      case -3:
switchD_001507f7_caseD_fffffffd:
        unaff_EBP = XML_ERROR_JUNK_AFTER_DOC_ELEMENT;
        goto LAB_001508e9;
      case -2:
        if (nextPtr == (char **)0x0) {
          unaff_EBP = XML_ERROR_PARTIAL_CHAR;
        }
        else {
LAB_0015089d:
          unaff_EBP = XML_ERROR_NONE;
          *nextPtr = s;
        }
        break;
      case -1:
        if (nextPtr != (char **)0x0) goto LAB_0015089d;
        unaff_EBP = XML_ERROR_UNCLOSED_TOKEN;
        break;
      default:
        if (iVar2 != -0xf) goto switchD_001507f7_caseD_fffffffd;
        if (*(long *)((long)parser + 0xa0) != 0) {
          *(char **)((long)parser + 0x220) = end;
          reportDefault(parser,*(ENCODING **)((long)parser + 0x118),s,end);
        }
      case -4:
        if (nextPtr != (char **)0x0) {
          *nextPtr = end;
        }
        unaff_EBP = XML_ERROR_NONE;
      }
LAB_001508e7:
      bVar1 = false;
    }
    else {
      if (iVar2 == 0xb) {
        iVar2 = reportProcessingInstruction(parser,*(ENCODING **)((long)parser + 0x118),s,local_38);
LAB_001508c8:
        if (iVar2 == 0) {
          unaff_EBP = XML_ERROR_NO_MEMORY;
          goto LAB_001508e7;
        }
      }
      else {
        if (iVar2 == 0xd) {
          iVar2 = reportComment(parser,*(ENCODING **)((long)parser + 0x118),s,local_38);
          goto LAB_001508c8;
        }
        if (iVar2 != 0xf) goto switchD_001507f7_caseD_fffffffd;
        if (*(long *)((long)parser + 0xa0) != 0) {
          reportDefault(parser,*(ENCODING **)((long)parser + 0x118),s,local_38);
        }
      }
      *(char **)((long)parser + 0x218) = local_38;
      bVar1 = true;
      s = local_38;
    }
LAB_001508e9:
    if (!bVar1) {
      return unaff_EBP;
    }
  } while( true );
}

Assistant:

static
enum XML_Error epilogProcessor(XML_Parser parser,
                               const char *s,
                               const char *end,
                               const char **nextPtr)
{
  processor = epilogProcessor;
  eventPtr = s;
  for (;;) {
    const char *next;
    int tok = XmlPrologTok(encoding, s, end, &next);
    eventEndPtr = next;
    switch (tok) {
    case -XML_TOK_PROLOG_S:
      if (defaultHandler) {
        eventEndPtr = end;
        reportDefault(parser, encoding, s, end);
      }
      /* fall through */
    case XML_TOK_NONE:
      if (nextPtr)
        *nextPtr = end;
      return XML_ERROR_NONE;
    case XML_TOK_PROLOG_S:
      if (defaultHandler)
        reportDefault(parser, encoding, s, next);
      break;
    case XML_TOK_PI:
      if (!reportProcessingInstruction(parser, encoding, s, next))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_COMMENT:
      if (!reportComment(parser, encoding, s, next))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_INVALID:
      eventPtr = next;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_PARTIAL:
      if (nextPtr) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_UNCLOSED_TOKEN;
    case XML_TOK_PARTIAL_CHAR:
      if (nextPtr) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_PARTIAL_CHAR;
    default:
      return XML_ERROR_JUNK_AFTER_DOC_ELEMENT;
    }
    eventPtr = s = next;
  }
}